

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

void __thiscall wasm::InlineMainPass::run(InlineMainPass *this,Module *module)

{
  Expression **ppEVar1;
  Expression *pEVar2;
  char *pcVar3;
  Function *into;
  Function *pFVar4;
  undefined8 in_RCX;
  Expression **ppEVar5;
  undefined1 auVar6 [8];
  string_view sVar7;
  InliningAction local_78;
  undefined1 local_68 [8];
  FindAllPointers<wasm::Call> calls;
  
  sVar7 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xb500c6),SUB81(in_RCX,0));
  into = Module::getFunctionOrNull(module,(Name)sVar7);
  sVar7 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xb6d027),SUB81(in_RCX,0));
  pFVar4 = Module::getFunctionOrNull(module,(Name)sVar7);
  if ((((into != (Function *)0x0) && (pFVar4 != (Function *)0x0)) &&
      ((into->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     ((pFVar4->super_Importable).module.super_IString.str._M_str == (char *)0x0)) {
    FindAllPointers<wasm::Call>::FindAllPointers
              ((FindAllPointers<wasm::Call> *)local_68,&into->body);
    calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if (local_68 !=
        (undefined1  [8])
        calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppEVar5 = (Expression **)0x0;
      auVar6 = local_68;
      do {
        ppEVar1 = *(Expression ***)auVar6;
        pEVar2 = *ppEVar1;
        if (pEVar2->_id != CallId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                        ,0x314,"T *wasm::Expression::cast() [T = wasm::Call]");
        }
        sVar7 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xb6d027),SUB81(in_RCX,0));
        pcVar3 = (char *)pEVar2[3].type.id;
        if ((pcVar3 == sVar7._M_str) && (ppEVar5 != (Expression **)0x0)) goto LAB_007568b9;
        if (pcVar3 != sVar7._M_str || ppEVar5 != (Expression **)0x0) {
          ppEVar1 = ppEVar5;
        }
        ppEVar5 = ppEVar1;
        auVar6 = (undefined1  [8])((long)auVar6 + 8);
      } while (auVar6 != (undefined1  [8])
                         calls.list.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (ppEVar5 != (Expression **)0x0) {
        local_78.callSite = ppEVar5;
        local_78.contents = pFVar4;
        anon_unknown_225::doInlining(module,into,&local_78,&((this->super_Pass).runner)->options);
      }
    }
LAB_007568b9:
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      (long)calls.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_68);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    auto* main = module->getFunctionOrNull(MAIN);
    auto* originalMain = module->getFunctionOrNull(ORIGINAL_MAIN);
    if (!main || main->imported() || !originalMain ||
        originalMain->imported()) {
      return;
    }
    FindAllPointers<Call> calls(main->body);
    Expression** callSite = nullptr;
    for (auto* call : calls.list) {
      if ((*call)->cast<Call>()->target == ORIGINAL_MAIN) {
        if (callSite) {
          // More than one call site.
          return;
        }
        callSite = call;
      }
    }
    if (!callSite) {
      // No call at all.
      return;
    }
    doInlining(
      module, main, InliningAction(callSite, originalMain), getPassOptions());
  }